

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

void ON_FileSystemPath::SplitPath
               (wchar_t *path,ON_wString *drive,ON_wString *dir,ON_wString *file_name_stem,
               ON_wString *ext)

{
  int iVar1;
  wchar_t *pwVar2;
  wchar_t *e;
  wchar_t *f;
  wchar_t *d;
  wchar_t *dr;
  ON_wString local_path;
  ON_wString OStack_58;
  wchar_t *local_50;
  wchar_t *local_48;
  wchar_t *local_40;
  wchar_t *local_38;
  ON_wString local_30;
  
  local_38 = (wchar_t *)0x0;
  local_40 = (wchar_t *)0x0;
  local_48 = (wchar_t *)0x0;
  local_50 = (wchar_t *)0x0;
  ON_wString::ON_wString(&local_30,path);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_30);
  on_wsplitpath(pwVar2,&local_38,&local_40,&local_48,&local_50);
  if (drive != (ON_wString *)0x0) {
    if (local_38 == (wchar_t *)0x0) {
      ON_wString::Empty(drive);
    }
    else {
      pwVar2 = local_40;
      if (((local_40 == (wchar_t *)0x0) && (pwVar2 = local_48, local_48 == (wchar_t *)0x0)) &&
         (pwVar2 = local_50, local_50 == (wchar_t *)0x0)) {
        iVar1 = ON_wString::Length(local_38);
      }
      else {
        iVar1 = (int)((ulong)((long)pwVar2 - (long)local_38) >> 2);
      }
      ON_wString::ON_wString(&OStack_58,local_38,iVar1);
      ON_wString::operator=(drive,&OStack_58);
      ON_wString::~ON_wString(&OStack_58);
    }
  }
  if (dir != (ON_wString *)0x0) {
    if (local_40 == (wchar_t *)0x0) {
      ON_wString::Empty(dir);
    }
    else {
      pwVar2 = local_48;
      if ((local_48 == (wchar_t *)0x0) && (pwVar2 = local_50, local_50 == (wchar_t *)0x0)) {
        iVar1 = ON_wString::Length(local_40);
      }
      else {
        iVar1 = (int)((ulong)((long)pwVar2 - (long)local_40) >> 2);
      }
      ON_wString::ON_wString(&OStack_58,local_40,iVar1);
      ON_wString::operator=(dir,&OStack_58);
      ON_wString::~ON_wString(&OStack_58);
    }
  }
  if (file_name_stem != (ON_wString *)0x0) {
    if (local_48 == (wchar_t *)0x0) {
      ON_wString::Empty(file_name_stem);
    }
    else {
      if (local_50 == (wchar_t *)0x0) {
        iVar1 = ON_wString::Length(local_48);
      }
      else {
        iVar1 = (int)((ulong)((long)local_50 - (long)local_48) >> 2);
      }
      ON_wString::ON_wString(&OStack_58,local_48,iVar1);
      ON_wString::operator=(file_name_stem,&OStack_58);
      ON_wString::~ON_wString(&OStack_58);
    }
  }
  if (ext != (ON_wString *)0x0) {
    ON_wString::operator=(ext,local_50);
  }
  ON_wString::~ON_wString(&local_30);
  return;
}

Assistant:

void ON_FileSystemPath::SplitPath( 
  const wchar_t* path,
  ON_wString* drive,
  ON_wString* dir,
  ON_wString* file_name_stem,
  ON_wString* ext
  )
{
  const wchar_t* dr = 0;
  const wchar_t* d = 0;
  const wchar_t* f = 0;
  const wchar_t* e = 0;

  // Use local path in case drive, dir, file_name_stem or ext are being reused.
  const ON_wString local_path(path);
  path = static_cast<const wchar_t*>(local_path);
  on_wsplitpath(path,&dr,&d,&f,&e);

  if ( 0 != drive )
  {
    if ( 0 != dr )
    {
      int length;
      if ( 0 != d )
        length = (int)(d-dr);
      else if ( 0 != f )
        length = (int)(f-dr);
      else if ( 0 != e )
        length = (int)(e-dr);
      else
        length = ON_wString::Length(dr);

      *drive = ON_wString(dr,length);
    }
    else
      drive->Empty();
  }

  if ( 0 != dir )
  {
    if ( 0 != d )
    {
      int length;
      if ( 0 != f )
        length = (int)(f-d);
      else if ( 0 != e )
        length = (int)(e-d);
      else
        length = ON_wString::Length(d);
      *dir = ON_wString(d,length);
    }
    else
      dir->Empty();
  }

  if ( 0 != file_name_stem )
  {
    if ( 0 != f )
    {
      int length;
      if ( 0 != e )
        length = (int)(e-f);
      else
        length = ON_wString::Length(f);
      *file_name_stem = ON_wString(f,length);
    }
    else
      file_name_stem->Empty();
  }

  if ( 0 != ext )
  {
    *ext = e;
  }
}